

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

void init_process_options(char *test,uv_exit_cb exit_cb)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar1 = uv_exepath(exepath,&exepath_size);
  if ((long)iVar1 == 0) {
    exepath[exepath_size] = '\0';
    args[0] = exepath;
    args[1] = test;
    args[4] = (char *)0x0;
    args[2] = (char *)0x0;
    args[3] = (char *)0x0;
    options.file = exepath;
    options.args = args;
    options.exit_cb = exit_cb;
    options.flags = 0;
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,0xa7,"r","==","0",(long)iVar1,"==",0);
  abort();
}

Assistant:

static void init_process_options(char* test, uv_exit_cb exit_cb) {
  /* Note spawn_helper1 defined in test/run-tests.c */
  int r = uv_exepath(exepath, &exepath_size);
  ASSERT_OK(r);
  exepath[exepath_size] = '\0';
  args[0] = exepath;
  args[1] = test;
  args[2] = NULL;
  args[3] = NULL;
  args[4] = NULL;
  options.file = exepath;
  options.args = args;
  options.exit_cb = exit_cb;
  options.flags = 0;
}